

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O1

void __thiscall HashTable<int>::HashTable(HashTable<int> *this,int *arr,int n)

{
  int *__dest;
  Node *pNVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar3 = (long)n * 4;
  }
  __dest = (int *)operator_new__(uVar3);
  this->copyArr = __dest;
  pNVar1 = (Node *)operator_new__(0x140);
  this->HashArray = pNVar1;
  this->numOfArray = n;
  if (0 < n) {
    memcpy(__dest,arr,(ulong)(uint)n << 2);
  }
  lVar2 = 8;
  do {
    *(undefined8 *)((long)pNVar1 + lVar2 + -8) = 0x98967f0098967f;
    *(undefined8 *)((long)&pNVar1->key + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x148);
  CreatHashTable(this);
  return;
}

Assistant:

HashTable(DataType arr[], int n) {
		copyArr = new DataType[n];
		HashArray = new Node[20];
		numOfArray = n;

		for (int i = 0; i < n; i++) {
			copyArr[i] = arr[i];			//拷贝一遍原数据
		}

		for (int i = 0; i < 20; i++) {		//初始化哈希主数组
				HashArray[i].key = MyNull;
				HashArray[i].value = MyNull;
				HashArray[i].next = NULL;
		}

		CreatHashTable();					//构建哈希表
	}